

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.hpp
# Opt level: O2

difference_t type_safe::operator-(index_t *lhs,index_t *rhs)

{
  integer_type_conflict1 iVar1;
  integer_type_conflict1 iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long *extraout_RDX;
  char **ppcVar6;
  code *pcVar7;
  StringRef SStack_58;
  char *local_10;
  undefined4 local_8;
  
  iVar1 = (lhs->
          super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
          ).value_.value_;
  if ((-1 < (long)iVar1) &&
     (iVar2 = (rhs->
              super_strong_typedef<type_safe::index_t,_type_safe::integer<unsigned_long,_type_safe::undefined_behavior_arithmetic>_>
              ).value_.value_, -1 < (long)iVar2)) {
    return (difference_t)(iVar1 - iVar2);
  }
  ppcVar6 = &local_10;
  local_10 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/integer.hpp"
  ;
  local_8 = 0x167;
  pcVar7 = debug_assert::detail::always_false;
  debug_assert::detail::
  do_assert<bool()noexcept,type_safe::detail::precondition_error_handler,char_const(&)[26]>
            (debug_assert::detail::always_false,ppcVar6,"","conversion would overflow");
  plVar3 = (long *)*ppcVar6;
  lVar4 = *plVar3;
  lVar5 = *extraout_RDX;
  Catch::StringRef::StringRef(&SStack_58,"==");
  *(undefined1 *)((long)pcVar7 + 8) = 1;
  *(bool *)((long)pcVar7 + 9) = lVar4 == lVar5;
  *(undefined ***)pcVar7 = &PTR_streamReconstructedExpression_0021dc50;
  *(long **)((long)pcVar7 + 0x10) = plVar3;
  *(char **)((long)pcVar7 + 0x18) = SStack_58.m_start;
  *(size_type *)((long)pcVar7 + 0x20) = SStack_58.m_size;
  *(long **)((long)pcVar7 + 0x28) = extraout_RDX;
  return (strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
          )(strong_typedef<type_safe::difference_t,_type_safe::integer<long,_type_safe::undefined_behavior_arithmetic>_>
            )pcVar7;
}

Assistant:

constexpr difference_t operator-(const index_t& lhs, const index_t& rhs) noexcept
{
    return difference_t(make_signed(get(lhs)) - make_signed(get(rhs)));
}